

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O0

void __thiscall
tcu::astc::anon_unknown_0::AssignBlock128::setBits
          (AssignBlock128 *this,int low,int high,deUint32 bits)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  ulong uVar4;
  Word bitsLowMask;
  int numBitsToSetInW0;
  int highNdxInW1;
  int lowNdxInW0;
  int word1Ndx;
  int word0Ndx;
  deUint32 bits_local;
  int high_local;
  int low_local;
  AssignBlock128 *this_local;
  
  if (high - low != -1) {
    iVar1 = low / 0x40;
    iVar2 = high / 0x40;
    bVar3 = (byte)(low % 0x40);
    if (iVar1 == iVar2) {
      this->m_words[iVar1] =
           this->m_words[iVar1] &
           ((1L << (((char)high - (char)low) + 1U & 0x3f)) + -1 << (bVar3 & 0x3f) ^
           0xffffffffffffffffU) | (ulong)bits << (bVar3 & 0x3f);
    }
    else {
      uVar4 = (1L << (0x40 - bVar3 & 0x3f)) - 1;
      this->m_words[iVar1] =
           this->m_words[iVar1] & (1L << (bVar3 & 0x3f)) - 1U | (bits & uVar4) << (bVar3 & 0x3f);
      this->m_words[iVar2] =
           this->m_words[iVar2] &
           ((1L << ((char)(high % 0x40) + 1U & 0x3f)) - 1U ^ 0xffffffffffffffff) |
           ((ulong)bits & (uVar4 ^ 0xffffffffffffffff)) >> (0x40 - bVar3 & 0x3f);
    }
  }
  return;
}

Assistant:

void setBits (int low, int high, deUint32 bits)
	{
		DE_ASSERT(de::inBounds(low, 0, 128));
		DE_ASSERT(de::inBounds(high, 0, 128));
		DE_ASSERT(de::inRange(high-low+1, 0, 32));
		DE_ASSERT((bits & (((Word)1 << (high-low+1)) - 1)) == bits);

		if (high-low+1 == 0)
			return;

		const int word0Ndx		= low / WORD_BITS;
		const int word1Ndx		= high / WORD_BITS;
		const int lowNdxInW0	= low % WORD_BITS;

		if (word0Ndx == word1Ndx)
			m_words[word0Ndx] = (m_words[word0Ndx] & ~((((Word)1 << (high-low+1)) - 1) << lowNdxInW0)) | ((Word)bits << lowNdxInW0);
		else
		{
			DE_ASSERT(word1Ndx == word0Ndx + 1);

			const int	highNdxInW1			= high % WORD_BITS;
			const int	numBitsToSetInW0	= WORD_BITS - lowNdxInW0;
			const Word	bitsLowMask			= ((Word)1 << numBitsToSetInW0) - 1;

			m_words[word0Ndx] = (m_words[word0Ndx] & (((Word)1 << lowNdxInW0) - 1))			| (((Word)bits & bitsLowMask) << lowNdxInW0);
			m_words[word1Ndx] = (m_words[word1Ndx] & ~(((Word)1 << (highNdxInW1+1)) - 1))	| (((Word)bits & ~bitsLowMask) >> numBitsToSetInW0);
		}
	}